

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O0

__type * __thiscall NS::wrap<NS*,NS*,NS*>(NS *this,NS *first,NS *rest,NS *rest_1)

{
  __type *in_RDI;
  NS *in_R8;
  __type *__tpls;
  NS *in_stack_ffffffffffffffc0;
  NS *in_stack_ffffffffffffffc8;
  NS *in_stack_ffffffffffffffd0;
  
  __tpls = in_RDI;
  wrap<NS*>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  wrap<NS*,NS*>(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::tuple_cat<std::tuple<N*>,std::tuple<N*,N*>,void>
            ((tuple<N_*> *)__tpls,(tuple<N_*,_N_*> *)in_RDI);
  return __tpls;
}

Assistant:

auto wrap(DataType first, Args  ... rest) {
        return std::tuple_cat(wrap(first), wrap(rest...));
    }